

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall
ON_DimStyle::Internal_SetColorMember
          (ON_DimStyle *this,field field_id,ON_Color value,ON_Color *class_member)

{
  uint uVar1;
  uint uVar2;
  bool bValueChanged;
  ON_Color *class_member_local;
  field field_id_local;
  ON_DimStyle *this_local;
  ON_Color value_local;
  
  this_local._4_4_ = value.field_0;
  uVar1 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)((long)&this_local + 4));
  uVar2 = ON_Color::operator_cast_to_unsigned_int(class_member);
  if (uVar1 != uVar2) {
    class_member->field_0 = this_local._4_4_;
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return uVar1 != uVar2;
}

Assistant:

bool ON_DimStyle::Internal_SetColorMember(
  ON_DimStyle::field field_id,
  ON_Color value,
  ON_Color& class_member
)
{
  bool bValueChanged = false;
  if (value != class_member)
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}